

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::Matchers::Impl::StdString::EndsWith::match(EndsWith *this,string *expr)

{
  bool bVar1;
  string local_30;
  
  CasedString::adjustString(&local_30,&this->m_data,expr);
  bVar1 = endsWith(&local_30,&(this->m_data).m_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

virtual bool match( std::string const& expr ) const {
                return endsWith( m_data.adjustString( expr ), m_data.m_str );
            }